

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

ostream * tchecker::output(ostream *os,clock_reset_t *r,clock_index_t *index)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  clock_id_t right_id;
  clock_id_t local_20;
  clock_id_t local_1c;
  
  local_1c = r->_left_id;
  pbVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(index,&local_1c);
  std::operator<<(os,(string *)pbVar2);
  std::operator<<(os,"=");
  local_20 = r->_right_id;
  iVar1 = r->_value;
  if (local_20 == 0x7fffffff) {
    std::ostream::operator<<((ostream *)os,iVar1);
  }
  else {
    if (iVar1 != 0) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
      std::operator<<(poVar3,"+");
    }
    pbVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(index,&local_20);
    std::operator<<(os,(string *)pbVar2);
  }
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::clock_reset_t const & r, tchecker::clock_index_t const & index)
{
  os << index.value(r.left_id());
  os << "=";
  tchecker::clock_id_t right_id = r.right_id();
  tchecker::integer_t value = r.value();
  if (right_id != tchecker::REFCLOCK_ID) {
    if (value != 0)
      os << value << "+";
    os << index.value(right_id);
  }
  else
    os << value;
  return os;
}